

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_LBackward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  char cVar1;
  long lVar2;
  complex<float> **ppcVar3;
  complex<float> *pcVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  complex<float> *pcVar6;
  long lVar7;
  int64_t j;
  long col;
  complex<float> *__x;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  complex<float> val;
  
  lVar2 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (((lVar2 != CONCAT44(extraout_var,iVar5)) ||
      (cVar1 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed,
      cVar1 == '\x03')) || (cVar1 == '\0')) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Subst_LBackward(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
  }
  iVar5 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  lVar2 = CONCAT44(extraout_var_00,iVar5);
  while (lVar7 = lVar2, 1 < lVar7) {
    lVar2 = lVar7 + -1;
    for (col = 0; col < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
        col = col + 1) {
      ppcVar3 = (this->fElem).fStore;
      __x = ppcVar3[lVar2];
      pcVar4 = ppcVar3[lVar7];
      pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(B,lVar2,col);
      val._M_value = pcVar6->_M_value;
      while( true ) {
        __x = __x + 1;
        pcVar6 = pcVar6 + -1;
        if (pcVar4 <= __x) break;
        std::operator*(__x,&val);
        pcVar6->_M_value =
             CONCAT44((float)(pcVar6->_M_value >> 0x20) - extraout_XMM0_Db,
                      (float)pcVar6->_M_value - extraout_XMM0_Da);
      }
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed || this->fDecomposed == ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
    
    int64_t Dimension = this->Dim();
    for ( int64_t k = Dimension-1; k > 0; k-- ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            //		TVar val = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            // substract the column of the skyline matrix from the vector.
            
            TVar val = *BPtr;
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    return( 1 );
}